

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

GenericMap * __thiscall avro::GenericMap::operator=(GenericMap *this,GenericMap *param_1)

{
  boost::shared_ptr<avro::Node>::operator=
            ((shared_ptr<avro::Node> *)this,(shared_ptr<avro::Node> *)param_1);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::GenericDatum>_>_>
  ::operator=(&this->value_,&param_1->value_);
  return this;
}

Assistant:

class AVRO_DECL GenericMap : public GenericContainer {
public:
    /**
     * The contents type for the map.
     */
    typedef std::vector<std::pair<std::string, GenericDatum> > Value;

    /**
     * Constructs a generic map corresponding to the given schema \p schema,
     * which should be of Avro type map.
     */
    GenericMap(const NodePtr& schema) : GenericContainer(AVRO_MAP, schema) {
    }

    /**
     * Returns the contents of this map.
     */
    const Value& value() const {
        return value_;
    }

    /**
     * Returns the reference to the contents of this map.
     */
    Value& value() {
        return value_;
    }
private:
    Value value_;
}